

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

int __thiscall Catch::Session::runInternal(Session *this)

{
  bool bVar1;
  unsigned_long *puVar2;
  int *piVar3;
  long in_RDI;
  IConfig *unaff_retaddr;
  shared_ptr<Catch::Config> *in_stack_00000008;
  exception *ex;
  Totals totals;
  Option<unsigned_long> listed;
  shared_ptr<Catch::Config> *in_stack_00000300;
  __shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffff50;
  Session *in_stack_ffffffffffffff60;
  int local_74;
  int local_70 [4];
  int local_60;
  uint local_34;
  Option<unsigned_long> local_30 [2];
  int local_4;
  
  if ((*(byte *)(in_RDI + 0x158) & 1) == 0) {
    if (((*(byte *)(in_RDI + 0x6f) & 1) == 0) && ((*(byte *)(in_RDI + 0x72) & 1) == 0)) {
      config(in_stack_ffffffffffffff60);
      clara::std::__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator*(in_stack_ffffffffffffff50);
      seedRng((IConfig *)in_stack_ffffffffffffff50);
      if ((*(byte *)(in_RDI + 0x71) & 1) != 0) {
        clara::std::__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator*(in_stack_ffffffffffffff50);
        anon_unknown_1::applyFilenamesAsTags(unaff_retaddr);
      }
      list(in_stack_00000008);
      bVar1 = Option::operator_cast_to_bool((Option<unsigned_long> *)0x129fbb);
      if (bVar1) {
        puVar2 = Option<unsigned_long>::operator*(local_30);
        local_4 = (int)*puVar2;
      }
      local_34 = (uint)bVar1;
      Option<unsigned_long>::~Option((Option<unsigned_long> *)0x12a0c1);
      if (local_34 == 0) {
        anon_unknown_1::runTests(in_stack_00000300);
        local_74 = local_60;
        piVar3 = clara::std::max<int>(local_70,&local_74);
        piVar3 = clara::std::min<int>(&(anonymous_namespace)::MaxExitCode,piVar3);
        local_4 = *piVar3;
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int Session::runInternal() {
        if( m_startupExceptions )
            return 1;

        if (m_configData.showHelp || m_configData.libIdentify) {
            return 0;
        }

        CATCH_TRY {
            config(); // Force config to be constructed

            seedRng( *m_config );

            if( m_configData.filenamesAsTags )
                applyFilenamesAsTags( *m_config );

            // Handle list request
            if( Option<std::size_t> listed = list( m_config ) )
                return static_cast<int>( *listed );

            auto totals = runTests( m_config );
            // Note that on unices only the lower 8 bits are usually used, clamping
            // the return value to 255 prevents false negative when some multiple
            // of 256 tests has failed
            return (std::min) (MaxExitCode, (std::max) (totals.error, static_cast<int>(totals.assertions.failed)));
        }